

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O0

void __thiscall
TApp_AddingComplexParser_Test::~TApp_AddingComplexParser_Test(TApp_AddingComplexParser_Test *this)

{
  TApp_AddingComplexParser_Test *this_local;
  
  TApp::~TApp(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, AddingComplexParser) {

    cx comp{0, 0};
    add_option(app, "-c,--complex", comp);
    args = {"-c", "1.5", "2.5"};

    run();

    EXPECT_EQ(1.5, comp.real());
    EXPECT_EQ(2.5, comp.imag());
}